

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

uint8_t * get_ls_tile_buffers(AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,
                             TileBufferDec (*tile_buffers) [64])

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  TileBufferDec (*tile_buffers_00) [64];
  _Bool _Var5;
  ulong uVar6;
  int iVar7;
  aom_internal_error_info *error_info;
  int iVar8;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  int iVar12;
  int row;
  ulong uVar13;
  bool bVar14;
  uint8_t *local_290;
  uint local_288;
  int local_284;
  long local_280;
  long local_278;
  int local_26c;
  int tile_height;
  int tile_width;
  ulong local_260;
  TileBufferDec (*local_258) [64];
  uint8_t *local_250;
  ulong local_248 [2];
  uint8_t *tile_col_data_end [64];
  
  uVar1 = (pbi->common).tiles.cols;
  iVar8 = (pbi->common).tiles.rows;
  if ((int)(iVar8 * uVar1) < 2) {
    (*tile_buffers)[0].data = data;
    (*tile_buffers)[0].size = (long)data_end - (long)data;
    local_290 = (uint8_t *)0x0;
  }
  else {
    local_290 = data;
    local_258 = tile_buffers;
    memset(tile_col_data_end,0,0x200);
    iVar7 = pbi->dec_tile_row;
    local_280 = CONCAT44(local_280._4_4_,iVar7);
    iVar12 = iVar8;
    if (iVar7 < iVar8) {
      iVar12 = iVar7;
    }
    uVar2 = pbi->dec_tile_col;
    uVar4 = uVar1;
    if ((int)uVar2 < (int)uVar1) {
      uVar4 = uVar2;
    }
    local_248[0] = (ulong)uVar4;
    if ((int)uVar2 < 0) {
      local_248[0] = 0;
    }
    local_284 = pbi->tile_size_bytes;
    local_288 = uVar4 + 1;
    if ((int)uVar2 < 0) {
      local_288 = uVar1;
    }
    local_278 = (long)pbi->tile_col_size_bytes;
    _Var5 = av1_get_uniform_tile_size(&pbi->common,&tile_width,&tile_height);
    if (!_Var5) {
      aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,
                         "Not all the tiles in the tile list have the same size.");
    }
    if (tile_height < tile_width) {
      tile_height = tile_width;
    }
    local_26c = tile_height << 2;
    uVar6 = (ulong)(uVar1 - 1);
    error_info = &pbi->error;
    local_248[1] = (long)(int)uVar1;
    uVar13 = 0;
    if (0 < (int)uVar1) {
      uVar13 = (ulong)uVar1;
    }
    local_260 = uVar6;
    local_250 = data;
    for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
      sVar11 = (long)data_end - (long)data;
      if (uVar6 == uVar9) {
        tile_col_data_end[uVar6] = data_end;
      }
      else {
        if ((long)sVar11 < local_278) {
          aom_internal_error(error_info,AOM_CODEC_CORRUPT_FRAME,
                             "Not enough data to read tile_col_size");
        }
        lVar10 = local_278;
        sVar11 = mem_get_varsize(data,(int)local_278);
        data = data + lVar10;
        if ((ulong)((long)data_end - (long)data) < sVar11) {
          aom_internal_error(error_info,AOM_CODEC_CORRUPT_FRAME,
                             "tile_col_data_end[%d] is out of bound",uVar9 & 0xffffffff);
        }
        tile_col_data_end[uVar9] = data + sVar11;
        uVar6 = local_260;
      }
      data = data + sVar11;
    }
    bVar3 = local_26c < 0x101;
    bVar14 = (int)local_280 < 0;
    local_290 = local_250;
    lVar10 = (long)(int)local_248[0];
    local_280 = (long)(int)local_288;
    iVar7 = iVar12 + 1;
    if (bVar14) {
      iVar7 = iVar8;
    }
    for (; tile_buffers_00 = local_258, lVar10 < local_280; lVar10 = lVar10 + 1) {
      if (0 < lVar10) {
        local_290 = tile_col_data_end[lVar10 + -1];
      }
      iVar12 = iVar8;
      if (lVar10 != (int)uVar6) {
        local_290 = local_290 + local_278;
        iVar12 = iVar7;
      }
      row = 0;
      if (iVar12 < 1) {
        iVar12 = row;
      }
      for (; iVar12 != row; row = row + 1) {
        get_ls_tile_buffer(tile_col_data_end[lVar10],error_info,&local_290,local_258,local_284,
                           (int)lVar10,row,(uint)bVar3);
      }
    }
    if (local_288 != (uint)local_248[1]) {
      local_290 = (uint8_t *)local_248[local_248[1]];
      iVar7 = 0;
      if (iVar8 < 1) {
        iVar8 = iVar7;
      }
      for (; iVar8 != iVar7; iVar7 = iVar7 + 1) {
        get_ls_tile_buffer(tile_col_data_end[(int)uVar6],error_info,&local_290,tile_buffers_00,
                           local_284,(int)local_260,iVar7,(uint)bVar3);
      }
    }
  }
  return local_290;
}

Assistant:

static const uint8_t *get_ls_tile_buffers(
    AV1Decoder *pbi, const uint8_t *data, const uint8_t *data_end,
    TileBufferDec (*const tile_buffers)[MAX_TILE_COLS]) {
  AV1_COMMON *const cm = &pbi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  const int have_tiles = tile_cols * tile_rows > 1;
  const uint8_t *raw_data_end;  // The end of the last tile buffer

  if (!have_tiles) {
    const size_t tile_size = data_end - data;
    tile_buffers[0][0].data = data;
    tile_buffers[0][0].size = tile_size;
    raw_data_end = NULL;
  } else {
    // We locate only the tile buffers that are required, which are the ones
    // specified by pbi->dec_tile_col and pbi->dec_tile_row. Also, we always
    // need the last (bottom right) tile buffer, as we need to know where the
    // end of the compressed frame buffer is for proper superframe decoding.

    const uint8_t *tile_col_data_end[MAX_TILE_COLS] = { NULL };
    const uint8_t *const data_start = data;

    const int dec_tile_row = AOMMIN(pbi->dec_tile_row, tile_rows);
    const int single_row = pbi->dec_tile_row >= 0;
    const int tile_rows_start = single_row ? dec_tile_row : 0;
    const int tile_rows_end = single_row ? tile_rows_start + 1 : tile_rows;
    const int dec_tile_col = AOMMIN(pbi->dec_tile_col, tile_cols);
    const int single_col = pbi->dec_tile_col >= 0;
    const int tile_cols_start = single_col ? dec_tile_col : 0;
    const int tile_cols_end = single_col ? tile_cols_start + 1 : tile_cols;

    const int tile_col_size_bytes = pbi->tile_col_size_bytes;
    const int tile_size_bytes = pbi->tile_size_bytes;
    int tile_width, tile_height;
    if (!av1_get_uniform_tile_size(cm, &tile_width, &tile_height)) {
      aom_internal_error(
          &pbi->error, AOM_CODEC_CORRUPT_FRAME,
          "Not all the tiles in the tile list have the same size.");
    }
    const int tile_copy_mode =
        ((AOMMAX(tile_width, tile_height) << MI_SIZE_LOG2) <= 256) ? 1 : 0;
    // Read tile column sizes for all columns (we need the last tile buffer)
    for (int c = 0; c < tile_cols; ++c) {
      const int is_last = c == tile_cols - 1;
      size_t tile_col_size;

      if (!is_last) {
        if (tile_col_size_bytes > data_end - data) {
          aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                             "Not enough data to read tile_col_size");
        }
        tile_col_size = mem_get_varsize(data, tile_col_size_bytes);
        data += tile_col_size_bytes;
        if (tile_col_size > (size_t)(data_end - data)) {
          aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                             "tile_col_data_end[%d] is out of bound", c);
        }
        tile_col_data_end[c] = data + tile_col_size;
      } else {
        tile_col_size = data_end - data;
        tile_col_data_end[c] = data_end;
      }
      data += tile_col_size;
    }

    data = data_start;

    // Read the required tile sizes.
    for (int c = tile_cols_start; c < tile_cols_end; ++c) {
      const int is_last = c == tile_cols - 1;

      if (c > 0) data = tile_col_data_end[c - 1];

      if (!is_last) data += tile_col_size_bytes;

      // Get the whole of the last column, otherwise stop at the required tile.
      for (int r = 0; r < (is_last ? tile_rows : tile_rows_end); ++r) {
        get_ls_tile_buffer(tile_col_data_end[c], &pbi->error, &data,
                           tile_buffers, tile_size_bytes, c, r, tile_copy_mode);
      }
    }

    // If we have not read the last column, then read it to get the last tile.
    if (tile_cols_end != tile_cols) {
      const int c = tile_cols - 1;

      data = tile_col_data_end[c - 1];

      for (int r = 0; r < tile_rows; ++r) {
        get_ls_tile_buffer(tile_col_data_end[c], &pbi->error, &data,
                           tile_buffers, tile_size_bytes, c, r, tile_copy_mode);
      }
    }
    raw_data_end = data;
  }
  return raw_data_end;
}